

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PopStyleColor(int count)

{
  ImVector<ImGuiColMod> *this;
  ImVec4 *pIVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiContext *pIVar5;
  value_type *pvVar6;
  
  pIVar5 = GImGui;
  this = &GImGui->ColorModifiers;
  for (; 0 < count; count = count + -1) {
    pvVar6 = ImVector<ImGuiColMod>::back(this);
    fVar2 = (pvVar6->BackupValue).y;
    fVar3 = (pvVar6->BackupValue).z;
    fVar4 = (pvVar6->BackupValue).w;
    pIVar1 = (pIVar5->Style).Colors + pvVar6->Col;
    pIVar1->x = (pvVar6->BackupValue).x;
    pIVar1->y = fVar2;
    pIVar1->z = fVar3;
    pIVar1->w = fVar4;
    ImVector<ImGuiColMod>::pop_back(this);
  }
  return;
}

Assistant:

void ImGui::PopStyleColor(int count)
{
    ImGuiContext& g = *GImGui;
    while (count > 0)
    {
        ImGuiColMod& backup = g.ColorModifiers.back();
        g.Style.Colors[backup.Col] = backup.BackupValue;
        g.ColorModifiers.pop_back();
        count--;
    }
}